

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

void __thiscall Assimp::FBXExporter::WriteAllNodes(FBXExporter *this)

{
  WriteHeaderExtension(this);
  WriteGlobalSettings(this);
  WriteDocuments(this);
  WriteReferences(this);
  WriteDefinitions(this);
  WriteObjects(this);
  WriteConnections(this);
  return;
}

Assistant:

void FBXExporter::WriteAllNodes ()
{
    // header
    // (and fileid, creation time, creator, if binary)
    WriteHeaderExtension();

    // global settings
    WriteGlobalSettings();

    // documents
    WriteDocuments();

    // references
    WriteReferences();

    // definitions
    WriteDefinitions();

    // objects
    WriteObjects();

    // connections
    WriteConnections();

    // WriteTakes? (deprecated since at least 2015 (fbx 7.4))
}